

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O2

int __thiscall zmq::dish_t::xxrecv(dish_t *this,msg_t *msg_)

{
  ssize_t sVar1;
  char *__s;
  size_type sVar2;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  int in_R8D;
  allocator<char> local_51;
  key_type local_50;
  
  do {
    sVar1 = fq_t::recv(&this->_fq,(int)msg_,in_RDX,in_RCX,in_R8D);
    if ((int)sVar1 != 0) {
      return -1;
    }
    __s = msg_t::group(msg_);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->_subscriptions,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    in_RDX = extraout_RDX;
  } while (sVar2 == 0);
  return 0;
}

Assistant:

int zmq::dish_t::xxrecv (msg_t *msg_)
{
    do {
        //  Get a message using fair queueing algorithm.
        const int rc = _fq.recv (msg_);

        //  If there's no message available, return immediately.
        //  The same when error occurs.
        if (rc != 0)
            return -1;

        //  Skip non matching messages
    } while (0 == _subscriptions.count (std::string (msg_->group ())));

    //  Found a matching message
    return 0;
}